

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.cc
# Opt level: O1

const_iterator __thiscall
String::load(String *this,void *container_ptr,size_t element_count,InputStream *stream,
            const_iterator begin,const_iterator end)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  *(undefined8 *)((long)container_ptr + 8) = 0;
  **container_ptr = 0;
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_38,element_count);
  (**(code **)(*(long *)stream + 0x10))
            (stream,local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,element_count);
  std::__cxx11::string::append
            ((char *)container_ptr,
             (ulong)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  if (local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return (const_iterator)(begin._M_current + 2);
}

Assistant:

Container::MarshalOps::const_iterator String::load(
        void* container_ptr, size_t element_count,
        InputStream& stream,
        MarshalOps::const_iterator const begin, MarshalOps::const_iterator const end) const
{
    std::string* string_ptr =
        reinterpret_cast< std::string* >(container_ptr);

    string_ptr->clear();

    std::vector<uint8_t> buffer;
    buffer.resize(element_count);
    stream.read(&buffer[0], element_count);
    (*string_ptr).append(reinterpret_cast<const char*>(&buffer[0]), element_count);
    return begin + 2;
}